

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftraster.c
# Opt level: O3

Bool End_Profile(black_PWorker worker,Bool overshoot)

{
  PProfile pTVar1;
  PProfile_conflict pTVar2;
  PProfile pTVar3;
  long lVar4;
  
  pTVar1 = (PProfile)worker->top;
  pTVar2 = worker->cProfile;
  lVar4 = (long)pTVar1 - (long)pTVar2->offset >> 3;
  if (lVar4 < 0) {
    worker->error = 99;
  }
  else {
    pTVar3 = pTVar1;
    if (pTVar1 != (PProfile)pTVar2->offset) {
      pTVar2->height = lVar4;
      if (overshoot != '\0') {
        pTVar2->flags = (ushort)((pTVar2->flags & 8) == 0) * 0x10 + 0x10 | pTVar2->flags;
      }
      worker->cProfile = pTVar1;
      pTVar3 = pTVar1 + 1;
      worker->top = &pTVar3->X;
      pTVar1->height = 0;
      pTVar1->offset = &pTVar3->X;
      pTVar2->next = pTVar1;
      worker->num_Profs = worker->num_Profs + 1;
    }
    if (pTVar3 < (PProfile)worker->maxBuff) {
      worker->joint = '\0';
      return '\0';
    }
    worker->error = 0x62;
  }
  return '\x01';
}

Assistant:

static Bool
  End_Profile( RAS_ARGS Bool  overshoot )
  {
    Long  h;


    h = (Long)( ras.top - ras.cProfile->offset );

    if ( h < 0 )
    {
      FT_ERROR(( "End_Profile: negative height encountered\n" ));
      ras.error = FT_THROW( Raster_Negative_Height );
      return FAILURE;
    }

    if ( h > 0 )
    {
      PProfile  oldProfile;


      FT_TRACE6(( "  ending profile %p, start = %ld, height = %ld\n",
                  (void *)ras.cProfile, ras.cProfile->start, h ));

      ras.cProfile->height = h;
      if ( overshoot )
      {
        if ( ras.cProfile->flags & Flow_Up )
          ras.cProfile->flags |= Overshoot_Top;
        else
          ras.cProfile->flags |= Overshoot_Bottom;
      }

      oldProfile   = ras.cProfile;
      ras.cProfile = (PProfile)ras.top;

      ras.top += AlignProfileSize;

      ras.cProfile->height = 0;
      ras.cProfile->offset = ras.top;

      oldProfile->next = ras.cProfile;
      ras.num_Profs++;
    }

    if ( ras.top >= ras.maxBuff )
    {
      FT_TRACE1(( "overflow in End_Profile\n" ));
      ras.error = FT_THROW( Raster_Overflow );
      return FAILURE;
    }

    ras.joint = FALSE;

    return SUCCESS;
  }